

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O0

void __thiscall GLRParser::toDot(GLRParser *this,string *filename)

{
  Production *this_00;
  GLRTransition *this_01;
  bool bVar1;
  bool bVar2;
  reference ppGVar3;
  string *psVar4;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *this_02;
  reference ppPVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_03;
  set<GLRTransition_*,_std::less<GLRTransition_*>,_std::allocator<GLRTransition_*>_> *this_04;
  reference ppGVar6;
  GLRState *this_05;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  string local_460;
  allocator<char> local_439;
  string local_438;
  Connection local_418;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  Node local_318;
  Connection local_298;
  undefined1 local_238 [8];
  string stateTo;
  string *connectionString;
  GLRTransition *transition;
  iterator __end2_1;
  iterator __begin2_1;
  set<GLRTransition_*,_std::less<GLRTransition_*>,_std::allocator<GLRTransition_*>_> *__range2_1;
  string local_1e8;
  Node local_1c8;
  reference local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *el;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  Production *prod;
  iterator __end2;
  iterator __begin2;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *__range2;
  undefined1 local_100 [7];
  bool firstElem;
  undefined1 local_e0 [8];
  string stateLable;
  GLRState *state;
  iterator __end1;
  iterator __begin1;
  set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_> *__range1;
  allocator<char> local_89;
  string local_88;
  undefined1 auStack_68 [8];
  Graph graph;
  string *filename_local;
  GLRParser *this_local;
  
  graph.rankdir._M_string_length = 0;
  graph.rankdir.field_2._M_allocated_capacity = 0;
  graph.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  graph.rankdir._M_dataplus = (_Alloc_hider)0x0;
  graph.rankdir._1_7_ = 0;
  graph.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  graph.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  graph.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  graph.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  auStack_68 = (undefined1  [8])0x0;
  graph.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  graph.rankdir.field_2._8_8_ = filename;
  Graph::Graph((Graph *)auStack_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"TB",&local_89);
  Graph::setRankdir((Graph *)auStack_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  __end1 = std::set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_>::begin
                     (&this->states);
  state = (GLRState *)
          std::set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_>::end
                    (&this->states);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&state), bVar1) {
    ppGVar3 = std::_Rb_tree_const_iterator<GLRState_*>::operator*(&__end1);
    stateLable.field_2._8_8_ = *ppGVar3;
    psVar4 = GLRState::getName_abi_cxx11_((GLRState *)stateLable.field_2._8_8_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   "{",psVar4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   "|");
    std::__cxx11::string::~string((string *)local_100);
    bVar1 = true;
    this_02 = GLRState::getProductions((GLRState *)stateLable.field_2._8_8_);
    __end2 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::begin
                       (this_02);
    prod = (Production *)
           std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::end
                     (this_02);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&prod), bVar2) {
      ppPVar5 = std::_Rb_tree_const_iterator<Production_*>::operator*(&__end2);
      this_00 = *ppPVar5;
      if (!bVar1) {
        std::__cxx11::string::operator+=((string *)local_e0,"\\n");
      }
      bVar1 = false;
      psVar4 = Production::getFromP_abi_cxx11_(this_00);
      std::__cxx11::string::operator+=((string *)local_e0,(string *)psVar4);
      std::__cxx11::string::operator+=((string *)local_e0," -\\> ");
      this_03 = Production::getToP_abi_cxx11_(this_00);
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_03);
      el = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_03);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&el), bVar2) {
        local_148 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end3);
        std::__cxx11::string::operator+=((string *)local_e0,(string *)local_148);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      std::_Rb_tree_const_iterator<Production_*>::operator++(&__end2);
    }
    bVar1 = GLRState::isAccepting((GLRState *)stateLable.field_2._8_8_);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)local_e0,"|accepting state");
    }
    std::__cxx11::string::operator+=((string *)local_e0,"}");
    psVar4 = GLRState::getName_abi_cxx11_((GLRState *)stateLable.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"Mrecord",(allocator<char> *)((long)&__range2_1 + 7));
    Node::Node(&local_1c8,psVar4,(string *)local_e0,&local_1e8);
    Graph::addNode((Graph *)auStack_68,&local_1c8);
    Node::~Node(&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_1 + 7));
    this_04 = GLRState::getStatesTo((GLRState *)stateLable.field_2._8_8_);
    __end2_1 = std::
               set<GLRTransition_*,_std::less<GLRTransition_*>,_std::allocator<GLRTransition_*>_>::
               begin(this_04);
    transition = (GLRTransition *)
                 std::
                 set<GLRTransition_*,_std::less<GLRTransition_*>,_std::allocator<GLRTransition_*>_>
                 ::end(this_04);
    while (bVar1 = std::operator!=(&__end2_1,(_Self *)&transition), bVar1) {
      ppGVar6 = std::_Rb_tree_const_iterator<GLRTransition_*>::operator*(&__end2_1);
      this_01 = *ppGVar6;
      stateTo.field_2._8_8_ = GLRTransition::getLabel_abi_cxx11_(this_01);
      this_05 = GLRTransition::getStateTo(this_01);
      psVar4 = GLRState::getName_abi_cxx11_(this_05);
      std::__cxx11::string::string((string *)local_238,(string *)psVar4);
      psVar4 = GLRState::getName_abi_cxx11_((GLRState *)stateLable.field_2._8_8_);
      Connection::Connection(&local_298,psVar4,(string *)local_238,(string *)stateTo.field_2._8_8_);
      Graph::addConnection((Graph *)auStack_68,&local_298);
      Connection::~Connection(&local_298);
      std::__cxx11::string::~string((string *)local_238);
      std::_Rb_tree_const_iterator<GLRTransition_*>::operator++(&__end2_1);
    }
    std::__cxx11::string::~string((string *)local_e0);
    std::_Rb_tree_const_iterator<GLRState_*>::operator++(&__end1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"invis",&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"invis",&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"circle",&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"style=invis",&local_3b1);
  Node::Node(&local_318,&local_338,&local_360,&local_388,&local_3b0);
  Graph::addNode((Graph *)auStack_68,&local_318);
  Node::~Node(&local_318);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"invis",&local_439);
  startStateName_abi_cxx11_();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"Start",&local_481);
  Connection::Connection(&local_418,&local_438,&local_460,&local_480);
  Graph::addConnection((Graph *)auStack_68,&local_418);
  Connection::~Connection(&local_418);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator(&local_481);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator(&local_439);
  std::__cxx11::string::string((string *)&local_4a8,(string *)filename);
  Graph::build_file((Graph *)auStack_68,&local_4a8);
  std::__cxx11::string::~string((string *)&local_4a8);
  Graph::~Graph((Graph *)auStack_68);
  return;
}

Assistant:

void GLRParser::toDot(std::string filename) {
    Graph graph = Graph();
    graph.setRankdir("TB");
    for (auto state: states) {
        // TODO: getProductions()
        std::string stateLable = "{" + state->getName() + "|";
        bool firstElem = true;
        for (auto prod: state->getProductions()) {
            if (!firstElem) { stateLable += "\\n"; }
            firstElem = false;

            stateLable += prod->getFromP();
            stateLable += " -\\> ";
            for (const auto &el: prod->getToP()) {
                stateLable += el;
            }
        }

        if (state->isAccepting()) {
            stateLable += "|accepting state";
        }

        stateLable += "}";
        graph.addNode(Node(state->getName(), stateLable, "Mrecord"));

        for (auto transition: state->getStatesTo()) {
            const std::string &connectionString = transition->getLabel();
            std::string stateTo = transition->getStateTo()->getName();
            graph.addConnection(Connection(state->getName(), stateTo,
                                           connectionString));
        }
    }


    graph.addNode(Node("invis", "invis", "circle", "style=invis"));
    graph.addConnection(Connection("invis", startStateName(), "Start"));
    graph.build_file(std::move(filename));
}